

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_neg>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  long *in_RDI;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_neg op;
  Mat *m;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  int local_1a4;
  undefined1 (*local_158) [16];
  int local_150;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  lVar2 = in_RDI[7];
  iVar3 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_150 = 0; local_150 < (int)lVar2; local_150 = local_150 + 1) {
    local_158 = (undefined1 (*) [16])(*in_RDI + in_RDI[8] * (long)local_150 * in_RDI[2]);
    for (local_1a4 = 0; local_1a4 + 3 < iVar3; local_1a4 = local_1a4 + 4) {
      local_38 = (float)*(undefined8 *)*local_158;
      fStack_34 = (float)((ulong)*(undefined8 *)*local_158 >> 0x20);
      fStack_30 = (float)*(undefined8 *)(*local_158 + 8);
      fStack_2c = (float)((ulong)*(undefined8 *)(*local_158 + 8) >> 0x20);
      local_1b8 = CONCAT44(0.0 - fStack_34,0.0 - local_38);
      uStack_1b0 = CONCAT44(0.0 - fStack_2c,0.0 - fStack_30);
      auVar1._8_8_ = uStack_1b0;
      auVar1._0_8_ = local_1b8;
      *local_158 = auVar1;
      local_158 = local_158 + 1;
    }
    for (; local_1a4 < iVar3; local_1a4 = local_1a4 + 1) {
      *(uint *)*local_158 = *(uint *)*local_158 ^ 0x80000000;
      local_158 = (undefined1 (*) [16])(*local_158 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}